

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

LargeObjectHeader * __thiscall
Memory::LargeHeapBlock::GetHeader(LargeHeapBlock *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LargeObjectHeader *local_20;
  LargeObjectHeader *header;
  void *objectAddress_local;
  LargeHeapBlock *this_local;
  
  bVar2 = InPageHeapMode(this);
  if (bVar2) {
    local_20 = (LargeObjectHeader *)(this->super_HeapBlock).address;
    if ((long)objectAddress - (long)local_20 != 0x20) {
      local_20 = (LargeObjectHeader *)0x0;
    }
  }
  else {
    if ((objectAddress < (this->super_HeapBlock).address) || (this->addressEnd <= objectAddress)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x3b1,
                         "(objectAddress >= this->address && objectAddress < this->addressEnd)",
                         "objectAddress >= this->address && objectAddress < this->addressEnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_20 = GetHeaderFromAddress(objectAddress);
  }
  return local_20;
}

Assistant:

LargeObjectHeader *
LargeHeapBlock::GetHeader(void * objectAddress) const
{
    LargeObjectHeader * header = nullptr;
#ifdef RECYCLER_PAGE_HEAP
    if (this->InPageHeapMode())
    {
        header = (LargeObjectHeader*)this->address;
        if ((char*)objectAddress - (char*)header != sizeof(LargeObjectHeader))
        {
            header = nullptr;
        }
    }
    else
#endif
    {
        Assert(objectAddress >= this->address && objectAddress < this->addressEnd);
        header = GetHeaderFromAddress(objectAddress);
    }
    return header;
}